

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

bool __thiscall llvm::StringRef::getAsInteger(StringRef *this,uint Radix,APInt *Result)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  uint numBits;
  int iVar5;
  uint ShiftAmt;
  uint uVar6;
  uint uVar7;
  uint64_t val;
  uint uVar8;
  bool bVar9;
  StringRef local_78;
  APInt RadixAP;
  APInt CharAP;
  APInt local_40;
  
  val = (uint64_t)Radix;
  local_78.Data = this->Data;
  local_78.Length = this->Length;
  if (Radix == 0) {
    uVar3 = GetAutoSenseRadix(&local_78);
    val = (uint64_t)uVar3;
  }
  uVar3 = (uint)val;
  if (0x22 < uVar3 - 2) {
    __assert_fail("Radix > 1 && Radix <= 36",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/StringRef.cpp"
                  ,0x204,"bool llvm::StringRef::getAsInteger(unsigned int, APInt &) const");
  }
  if (local_78.Length == 0) {
    return true;
  }
  sVar4 = 1;
  do {
    if (sVar4 == 0) {
LAB_00170b11:
      RadixAP.BitWidth = 0x40;
      RadixAP.U.VAL = 0;
      APInt::clearUnusedBits(&RadixAP);
      APInt::operator=(Result,&RadixAP);
      APInt::~APInt(&RadixAP);
      return false;
    }
    cVar2 = front(&local_78);
    if (cVar2 != '0') {
      if (local_78.Length != 0) {
        uVar8 = -(int)local_78.Length;
        ShiftAmt = 0xffffffff;
        do {
          ShiftAmt = ShiftAmt + 1;
          uVar6 = 1;
          uVar7 = 1 << ((byte)ShiftAmt & 0x1f);
          uVar8 = uVar8 + (int)local_78.Length;
        } while (uVar7 < uVar3);
        uVar1 = Result->BitWidth;
        numBits = uVar1;
        if ((uVar1 <= uVar8) && (numBits = uVar8, uVar1 < uVar8)) {
          APInt::zext(&RadixAP,(uint)Result);
          APInt::operator=(Result,&RadixAP);
          APInt::~APInt(&RadixAP);
        }
        RadixAP.U.VAL = 0;
        CharAP.U.VAL = 0;
        RadixAP.BitWidth = uVar6;
        CharAP.BitWidth = uVar6;
        if (uVar7 != uVar3) {
          APInt::APInt(&local_40,numBits,val,false);
          APInt::operator=(&RadixAP,&local_40);
          APInt::~APInt(&local_40);
          APInt::APInt(&local_40,numBits,0,false);
          APInt::operator=(&CharAP,&local_40);
          APInt::~APInt(&local_40);
        }
        APInt::operator=(Result,0);
        do {
          bVar9 = local_78.Length == 0;
          if (bVar9) goto LAB_00170b44;
          cVar2 = operator[](&local_78,0);
          if (cVar2 < '0') {
LAB_00170a38:
            cVar2 = operator[](&local_78,0);
            if ('`' < cVar2) {
              cVar2 = operator[](&local_78,0);
              iVar5 = -0x57;
              if (cVar2 < '{') goto LAB_00170a7e;
            }
            cVar2 = operator[](&local_78,0);
            if (cVar2 < 'A') goto LAB_00170b44;
            cVar2 = operator[](&local_78,0);
            iVar5 = -0x37;
            if ('Z' < cVar2) goto LAB_00170b44;
          }
          else {
            cVar2 = operator[](&local_78,0);
            iVar5 = -0x30;
            if ('9' < cVar2) goto LAB_00170a38;
          }
LAB_00170a7e:
          cVar2 = operator[](&local_78,0);
          uVar8 = cVar2 + iVar5;
          if (uVar3 <= uVar8) {
LAB_00170b44:
            APInt::~APInt(&CharAP);
            APInt::~APInt(&RadixAP);
            return !bVar9;
          }
          if (uVar7 == uVar3) {
            APInt::operator<<=(Result,ShiftAmt);
            APInt::operator|=(Result,(ulong)uVar8);
          }
          else {
            APInt::operator*=(Result,&RadixAP);
            APInt::operator=(&CharAP,(ulong)uVar8);
            APInt::operator+=(Result,&CharAP);
          }
          bVar9 = local_78.Length != 0;
          local_78.Length = local_78.Length - bVar9;
          local_78.Data = local_78.Data + bVar9;
        } while( true );
      }
      goto LAB_00170b11;
    }
    sVar4 = local_78.Length - (local_78.Length != 0);
    local_78.Data = local_78.Data + (local_78.Length != 0);
    local_78.Length = sVar4;
  } while( true );
}

Assistant:

bool StringRef::getAsInteger(unsigned Radix, APInt &Result) const {
  StringRef Str = *this;

  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  assert(Radix > 1 && Radix <= 36);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Skip leading zeroes.  This can be a significant improvement if
  // it means we don't need > 64 bits.
  while (!Str.empty() && Str.front() == '0')
    Str = Str.substr(1);

  // If it was nothing but zeroes....
  if (Str.empty()) {
    Result = APInt(64, 0);
    return false;
  }

  // (Over-)estimate the required number of bits.
  unsigned Log2Radix = 0;
  while ((1U << Log2Radix) < Radix) Log2Radix++;
  bool IsPowerOf2Radix = ((1U << Log2Radix) == Radix);

  unsigned BitWidth = Log2Radix * Str.size();
  if (BitWidth < Result.getBitWidth())
    BitWidth = Result.getBitWidth(); // don't shrink the result
  else if (BitWidth > Result.getBitWidth())
    Result = Result.zext(BitWidth);

  APInt RadixAP, CharAP; // unused unless !IsPowerOf2Radix
  if (!IsPowerOf2Radix) {
    // These must have the same bit-width as Result.
    RadixAP = APInt(BitWidth, Radix);
    CharAP = APInt(BitWidth, 0);
  }

  // Parse all the bytes of the string given this radix.
  Result = 0;
  while (!Str.empty()) {
    unsigned CharVal;
    if (Str[0] >= '0' && Str[0] <= '9')
      CharVal = Str[0]-'0';
    else if (Str[0] >= 'a' && Str[0] <= 'z')
      CharVal = Str[0]-'a'+10;
    else if (Str[0] >= 'A' && Str[0] <= 'Z')
      CharVal = Str[0]-'A'+10;
    else
      return true;

    // If the parsed value is larger than the integer radix, the string is
    // invalid.
    if (CharVal >= Radix)
      return true;

    // Add in this character.
    if (IsPowerOf2Radix) {
      Result <<= Log2Radix;
      Result |= CharVal;
    } else {
      Result *= RadixAP;
      CharAP = CharVal;
      Result += CharAP;
    }

    Str = Str.substr(1);
  }

  return false;
}